

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

monster_race * get_mon_race_aux(long total,alloc_entry *table)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  
  uVar2 = Rand_div((uint32_t)total);
  uVar4 = (uint)alloc_race_size;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  else {
    piVar6 = &table->prob3;
    uVar5 = 0;
    lVar3 = (long)(int)uVar2;
    do {
      iVar1 = *piVar6;
      if (lVar3 < iVar1) {
        uVar4 = (uint)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
      piVar6 = piVar6 + 5;
      lVar3 = lVar3 - iVar1;
    } while (uVar4 != uVar5);
  }
  return r_info + table[uVar4].index;
}

Assistant:

static struct monster_race *get_mon_race_aux(long total,
											 const alloc_entry *table)
{
	int i;

	/* Pick a monster */
	long value = randint0(total);

	/* Find the monster */
	for (i = 0; i < alloc_race_size; i++) {
		/* Found the entry */
		if (value < table[i].prob3) break;

		/* Decrement */
		value -= table[i].prob3;
	}

	return &r_info[table[i].index];
}